

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::Name> * __thiscall
wasm::WATParser::ParseDefsCtx::getTable
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,Name *table)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  Table *pTVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  string local_70;
  Err local_50;
  
  if (table == (Name *)0x0) {
    puVar3 = (this->wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar3 == (this->wasm->tables).
                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"table required, but there is no table","");
      Lexer::err(&local_50,&this->in,(ulong)pos,&local_70);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err> = puVar1;
      paVar2 = &local_50.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.msg._M_dataplus._M_p == paVar2) {
        *puVar1 = CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                           local_50.msg.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x18) =
             local_50.msg.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err> = local_50.msg._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                          super__Move_assign_alias<wasm::Name,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x10) =
             CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                      local_50.msg.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) =
           local_50.msg._M_string_length;
      local_50.msg._M_string_length = 0;
      local_50.msg.field_2._M_local_buf[0] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\x01';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return __return_storage_ptr__;
      }
      local_50.msg._M_dataplus._M_p = (pointer)paVar2;
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    pTVar4 = (puVar3->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    uVar5 = *(undefined4 *)&(pTVar4->super_Importable).super_Named;
    uVar6 = *(undefined4 *)((long)&(pTVar4->super_Importable).super_Named + 4);
    uVar7 = *(undefined4 *)((long)&(pTVar4->super_Importable).super_Named + 8);
    uVar8 = *(undefined4 *)((long)&(pTVar4->super_Importable).super_Named + 0xc);
  }
  else {
    uVar5 = (undefined4)(table->super_IString).str._M_len;
    uVar6 = *(undefined4 *)((long)&(table->super_IString).str._M_len + 4);
    uVar7 = *(undefined4 *)&(table->super_IString).str._M_str;
    uVar8 = *(undefined4 *)((long)&(table->super_IString).str._M_str + 4);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err> = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err> + 4) = uVar6;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) = uVar7;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0xc) = uVar8;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<Name> getTable(Index pos, Name* table) {
    if (table) {
      return *table;
    }
    if (wasm.tables.empty()) {
      return in.err(pos, "table required, but there is no table");
    }
    return wasm.tables[0]->name;
  }